

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O2

void helicsDataBufferToVector(HelicsDataBuffer data,double *values,int maxlen,int *actualSize)

{
  DataType baseType;
  int iVar1;
  SmallBuffer *pSVar2;
  vector<double,_std::allocator<double>_> v;
  _Vector_base<double,_std::allocator<double>_> local_58;
  data_view local_38;
  
  if ((values != (double *)0x0 && 0 < maxlen) &&
     (pSVar2 = getBuffer(data), pSVar2 != (SmallBuffer *)0x0)) {
    local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_38.dblock._M_len = pSVar2->bufferSize;
    local_38.dblock._M_str = (char *)pSVar2->heap;
    local_38.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_38.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    baseType = helics::detail::detectType((byte *)local_38.dblock._M_str);
    helics::valueExtract(&local_38,baseType,(vector<double,_std::allocator<double>_> *)&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_38.ref.
                super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    iVar1 = (int)((ulong)((long)local_58._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_58._M_impl.super__Vector_impl_data._M_start) >> 3);
    if (iVar1 < maxlen) {
      maxlen = iVar1;
    }
    memcpy(values,local_58._M_impl.super__Vector_impl_data._M_start,(long)maxlen << 3);
    if (actualSize != (int *)0x0) {
      *actualSize = maxlen;
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_58);
    return;
  }
  if (actualSize != (int *)0x0) {
    *actualSize = 0;
  }
  return;
}

Assistant:

void helicsDataBufferToVector(HelicsDataBuffer data, double values[], int maxlen, int* actualSize)
{
    if ((values == nullptr) || (maxlen <= 0)) {
        if (actualSize != nullptr) {
            *actualSize = 0;
        }
        return;
    }
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        if (actualSize != nullptr) {
            *actualSize = 0;
        }
        return;
    }

    std::vector<double> v;
    helics::valueExtract(helics::data_view(*ptr), helics::detail::detectType(ptr->data()), v);

    auto length = (std::min)(static_cast<int>(v.size()), maxlen);
    std::memcpy(values, v.data(), length * sizeof(double));
    if (actualSize != nullptr) {
        *actualSize = length;
    }
}